

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForwardEuler.cpp
# Opt level: O2

bool __thiscall
iDynTree::optimalcontrol::integrators::ForwardEuler::oneStepIntegration
          (ForwardEuler *this,double t0,double dT,VectorDynSize *x0,VectorDynSize *x)

{
  element_type *peVar1;
  int iVar2;
  size_t sVar3;
  size_t sVar4;
  string *psVar5;
  char *pcVar6;
  pointer pcVar7;
  Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_> local_d0;
  Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_> local_b8;
  Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_> local_a0;
  CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>_>
  local_88;
  
  if ((this->super_FixedStepIntegrator).super_Integrator.m_dynamicalSystem_ptr.
      super___shared_ptr<iDynTree::optimalcontrol::DynamicalSystem,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr == (element_type *)0x0) {
    psVar5 = IntegratorInfo::name_abi_cxx11_
                       (&(this->super_FixedStepIntegrator).super_Integrator.m_info);
    pcVar7 = (psVar5->_M_dataplus)._M_p;
    pcVar6 = "First you have to specify a dynamical system";
  }
  else {
    sVar3 = iDynTree::VectorDynSize::size();
    sVar4 = DynamicalSystem::stateSpaceSize
                      ((this->super_FixedStepIntegrator).super_Integrator.m_dynamicalSystem_ptr.
                       super___shared_ptr<iDynTree::optimalcontrol::DynamicalSystem,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr);
    if (sVar3 == sVar4) {
      sVar3 = iDynTree::VectorDynSize::size();
      sVar4 = DynamicalSystem::stateSpaceSize
                        ((this->super_FixedStepIntegrator).super_Integrator.m_dynamicalSystem_ptr.
                         super___shared_ptr<iDynTree::optimalcontrol::DynamicalSystem,_(__gnu_cxx::_Lock_policy)2>
                         ._M_ptr);
      if (sVar3 != sVar4) {
        DynamicalSystem::stateSpaceSize
                  ((this->super_FixedStepIntegrator).super_Integrator.m_dynamicalSystem_ptr.
                   super___shared_ptr<iDynTree::optimalcontrol::DynamicalSystem,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr);
        iDynTree::VectorDynSize::resize((ulong)x);
      }
      peVar1 = (this->super_FixedStepIntegrator).super_Integrator.m_dynamicalSystem_ptr.
               super___shared_ptr<iDynTree::optimalcontrol::DynamicalSystem,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr;
      iVar2 = (*peVar1->_vptr_DynamicalSystem[2])(SUB84(t0,0),peVar1,x0,&this->m_computationBuffer);
      if ((char)iVar2 != '\0') {
        toEigen(&local_a0,x0);
        toEigen(&local_b8,&this->m_computationBuffer);
        local_88.m_rhs.m_rhs._0_8_ = local_b8._0_8_;
        local_88.m_rhs.m_rhs._8_8_ = local_b8._8_8_;
        local_88.m_rhs.m_rhs._16_1_ = local_b8._16_1_;
        local_88.m_lhs.
        super_MapBase<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_0>
        .m_data = local_a0.
                  super_MapBase<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_0>
                  .m_data;
        local_88.m_lhs.
        super_MapBase<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_0>
        .m_rows.m_value =
             local_a0.
             super_MapBase<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_0>
             .m_rows.m_value;
        local_88.m_lhs.
        super_MapBase<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_0>
        ._16_1_ = local_a0.
                  super_MapBase<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_0>
                  ._16_1_;
        local_88.m_rhs.m_lhs.m_rows.m_value = local_b8._8_8_;
        local_88.m_rhs.m_lhs.m_functor.m_other = dT;
        toEigen(&local_d0,x);
        Eigen::internal::
        call_assignment<Eigen::Map<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::Stride<0,0>>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Map<Eigen::Matrix<double,_1,1,0,_1,1>const,0,Eigen::Stride<0,0>>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>const,Eigen::Map<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::Stride<0,0>>const>const>>
                  (&local_d0,&local_88);
        return true;
      }
      psVar5 = IntegratorInfo::name_abi_cxx11_
                         (&(this->super_FixedStepIntegrator).super_Integrator.m_info);
      pcVar7 = (psVar5->_M_dataplus)._M_p;
      pcVar6 = "Error while evaluating the autonomous dynamics.";
    }
    else {
      psVar5 = IntegratorInfo::name_abi_cxx11_
                         (&(this->super_FixedStepIntegrator).super_Integrator.m_info);
      pcVar7 = (psVar5->_M_dataplus)._M_p;
      pcVar6 = "Wrong initial state dimension.";
    }
  }
  iDynTree::reportError(pcVar7,"oneStepIntegration",pcVar6);
  return false;
}

Assistant:

bool ForwardEuler::oneStepIntegration(double t0, double dT, const VectorDynSize &x0, VectorDynSize &x)
            {
                if (!m_dynamicalSystem_ptr) {
                    reportError(m_info.name().c_str(), "oneStepIntegration", "First you have to specify a dynamical system");
                    return false;
                }

                if (x0.size() != m_dynamicalSystem_ptr->stateSpaceSize()){
                    reportError(m_info.name().c_str(), "oneStepIntegration", "Wrong initial state dimension.");
                    return false;
                }

                if (x.size() != m_dynamicalSystem_ptr->stateSpaceSize()){
                    x.resize(static_cast<unsigned int>(m_dynamicalSystem_ptr->stateSpaceSize()));
                }

                if (!m_dynamicalSystem_ptr->dynamics(x0, t0, m_computationBuffer)){
                    reportError(m_info.name().c_str(), "oneStepIntegration", "Error while evaluating the autonomous dynamics.");
                    return false;
                }

                toEigen(x) = toEigen(x0) + dT * toEigen(m_computationBuffer);

                return true;
            }